

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t assertion_entry_compare_acls
                  (char *file,wchar_t line,archive_entry *ae,archive_test_acl_t *acls,wchar_t cnt,
                  wchar_t want_type,wchar_t mode)

{
  char *filename;
  wchar_t wVar1;
  mode_t mVar2;
  char **name_00;
  undefined4 uVar3;
  char *local_70;
  char *name;
  wchar_t local_60;
  wchar_t matched;
  wchar_t qual;
  wchar_t tag;
  wchar_t permset;
  wchar_t type;
  wchar_t ret;
  wchar_t n;
  wchar_t r;
  wchar_t i;
  wchar_t *marker;
  wchar_t want_type_local;
  wchar_t cnt_local;
  archive_test_acl_t *acls_local;
  archive_entry *ae_local;
  char *pcStack_18;
  wchar_t line_local;
  char *file_local;
  
  marker._0_4_ = want_type;
  marker._4_4_ = cnt;
  _want_type_local = acls;
  acls_local = (archive_test_acl_t *)ae;
  ae_local._4_4_ = line;
  pcStack_18 = file;
  assertion_count(file,line);
  permset = L'\0';
  type = L'\0';
  _r = (int *)malloc((long)marker._4_4_ << 2);
  for (n = L'\0'; n < marker._4_4_; n = n + L'\x01') {
    if ((_want_type_local[n].type & (wchar_t)marker) != 0) {
      _r[type] = n;
      type = type + L'\x01';
    }
  }
  if (type == L'\0') {
    failure_start(pcStack_18,ae_local._4_4_,"No ACL\'s to compare, type mask: %d",
                  (ulong)(uint)(wchar_t)marker);
    file_local._4_4_ = L'\x01';
  }
  else {
    while( true ) {
      name_00 = &local_70;
      ret = archive_entry_acl_next
                      ((archive_entry *)acls_local,(wchar_t)marker,&tag,&qual,&matched,&local_60,
                       name_00);
      uVar3 = (undefined4)((ulong)name_00 >> 0x20);
      if (ret != L'\0') break;
      name._4_4_ = 0;
      ret = L'\0';
      for (n = L'\0'; n < type && name._4_4_ == 0; n = n + L'\x01') {
        wVar1 = archive_test_acl_match(_want_type_local + _r[n],tag,qual,matched,local_60,local_70);
        if (wVar1 != L'\0') {
          _r[n] = _r[type + L'\xffffffff'];
          type = type + L'\xffffffff';
          name._4_4_ = 1;
        }
      }
      if ((tag == L'Ā') && (matched == L'✒')) {
        if (name._4_4_ == 0) {
          failure_start(pcStack_18,ae_local._4_4_,"No match for user_obj perm");
          failure_finish((void *)0x0);
          permset = L'\x01';
        }
        if (qual << 6 != (mode & 0x1c0U)) {
          failure_start(pcStack_18,ae_local._4_4_,"USER_OBJ permset (%02o) != user mode (%02o)",
                        (ulong)(uint)qual,(ulong)(uint)(mode >> 6 & 7));
          failure_finish((void *)0x0);
          permset = L'\x01';
        }
      }
      else if ((tag == L'Ā') && (matched == L'✔')) {
        if (name._4_4_ == 0) {
          failure_start(pcStack_18,ae_local._4_4_,"No match for group_obj perm");
          failure_finish((void *)0x0);
          permset = L'\x01';
        }
        if (qual << 3 != (mode & 0x38U)) {
          failure_start(pcStack_18,ae_local._4_4_,"GROUP_OBJ permset (%02o) != group mode (%02o)",
                        (ulong)(uint)qual,(ulong)(uint)(mode >> 3 & 7));
          failure_finish((void *)0x0);
          permset = L'\x01';
        }
      }
      else if ((tag == L'Ā') && (matched == L'✖')) {
        if (name._4_4_ == 0) {
          failure_start(pcStack_18,ae_local._4_4_,"No match for other perm");
          failure_finish((void *)0x0);
          permset = L'\x01';
        }
        if (qual != (mode & 7U)) {
          failure_start(pcStack_18,ae_local._4_4_,"OTHER permset (%02o) != other mode (%02o)",
                        (ulong)(uint)qual,(ulong)(uint)(mode & 7));
          failure_finish((void *)0x0);
          permset = L'\x01';
        }
      }
      else if (name._4_4_ != 1) {
        failure_start(pcStack_18,ae_local._4_4_,
                      "Could not find match for ACL (type=%#010x,permset=%#010x,tag=%d,qual=%d,name=``%s\'\')"
                      ,(ulong)(uint)tag,(ulong)(uint)qual,(ulong)(uint)matched,
                      CONCAT44((int)((ulong)name_00 >> 0x20),local_60),local_70);
        failure_finish((void *)0x0);
        permset = L'\x01';
      }
    }
    if (ret != L'\x01') {
      failure_start(pcStack_18,ae_local._4_4_,"Should not exit before EOF");
      failure_finish((void *)0x0);
      permset = L'\x01';
    }
    if ((((wchar_t)marker & 0x100U) != 0) &&
       (mVar2 = archive_entry_mode((archive_entry *)acls_local), filename = pcStack_18,
       wVar1 = ae_local._4_4_, (mode & 0x1ffU) != (mVar2 & 0x1ff))) {
      mVar2 = archive_entry_mode((archive_entry *)acls_local);
      failure_start(filename,wVar1,"Mode (%02o) and entry mode (%02o) mismatch",(ulong)(uint)mode,
                    (ulong)mVar2);
      failure_finish((void *)0x0);
      permset = L'\x01';
    }
    if (type != L'\0') {
      failure_start(pcStack_18,ae_local._4_4_,
                    "Could not find match for ACL (type=%#010x,permset=%#010x,tag=%d,qual=%d,name=``%s\'\')"
                    ,(ulong)(uint)_want_type_local[*_r].type,
                    (ulong)(uint)_want_type_local[*_r].permset,
                    (ulong)(uint)_want_type_local[*_r].tag,
                    CONCAT44(uVar3,_want_type_local[*_r].qual),_want_type_local[*_r].name);
      failure_finish((void *)0x0);
      permset = L'\x01';
    }
    free(_r);
    file_local._4_4_ = permset;
  }
  return file_local._4_4_;
}

Assistant:

int
assertion_entry_compare_acls(const char *file, int line,
    struct archive_entry *ae, struct archive_test_acl_t *acls, int cnt,
    int want_type, int mode)
{
	int *marker;
	int i, r, n, ret;
	int type, permset, tag, qual;
	int matched;
	const char *name;

	assertion_count(file, line);

	ret = 0;
	n = 0;
	marker = malloc(sizeof(marker[0]) * cnt);

	for (i = 0; i < cnt; i++) {
		if ((acls[i].type & want_type) != 0) {
			marker[n] = i;
			n++;
		}
	}

	if (n == 0) {
		failure_start(file, line, "No ACL's to compare, type mask: %d",
		    want_type);
		return (1);
	}

	while (0 == (r = archive_entry_acl_next(ae, want_type,
			 &type, &permset, &tag, &qual, &name))) {
		for (i = 0, matched = 0; i < n && !matched; i++) {
			if (archive_test_acl_match(&acls[marker[i]], type,
			    permset, tag, qual, name)) {
				/* We found a match; remove it. */
				marker[i] = marker[n - 1];
				n--;
				matched = 1;
			}
		}
		if (type == ARCHIVE_ENTRY_ACL_TYPE_ACCESS
		    && tag == ARCHIVE_ENTRY_ACL_USER_OBJ) {
			if (!matched) {
				failure_start(file, line, "No match for "
				    "user_obj perm");
				failure_finish(NULL);
				ret = 1;
			}
			if ((permset << 6) != (mode & 0700)) {
				failure_start(file, line, "USER_OBJ permset "
				    "(%02o) != user mode (%02o)",
				    (unsigned int)permset,
				    (unsigned int)(07 & (mode >> 6)));
				failure_finish(NULL);
				ret = 1;
			}
		} else if (type == ARCHIVE_ENTRY_ACL_TYPE_ACCESS
		    && tag == ARCHIVE_ENTRY_ACL_GROUP_OBJ) {
			if (!matched) {
				failure_start(file, line, "No match for "
				    "group_obj perm");
				failure_finish(NULL);
				ret = 1;
			}
			if ((permset << 3) != (mode & 0070)) {
				failure_start(file, line, "GROUP_OBJ permset "
				    "(%02o) != group mode (%02o)",
				    (unsigned int)permset,
				    (unsigned int)(07 & (mode >> 3)));
				failure_finish(NULL);
				ret = 1;
			}
		} else if (type == ARCHIVE_ENTRY_ACL_TYPE_ACCESS
		    && tag == ARCHIVE_ENTRY_ACL_OTHER) {
			if (!matched) {
				failure_start(file, line, "No match for "
				    "other perm");
				failure_finish(NULL);
				ret = 1;
			}
			if ((permset << 0) != (mode & 0007)) {
				failure_start(file, line, "OTHER permset "
				    "(%02o) != other mode (%02o)",
				    (unsigned int)permset,
				    (unsigned int)mode & 07);
				failure_finish(NULL);
				ret = 1;
			}
		} else if (matched != 1) {
			failure_start(file, line, "Could not find match for "
			    "ACL (type=%#010x,permset=%#010x,tag=%d,qual=%d,"
			    "name=``%s'')", (unsigned int)type,
			    (unsigned int)permset, tag, qual, name);
			failure_finish(NULL);
			ret = 1;
		}
	}
	if (r != ARCHIVE_EOF) {
		failure_start(file, line, "Should not exit before EOF");
		failure_finish(NULL);
		ret = 1;
	}
	if ((want_type & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0 &&
	    (mode_t)(mode & 0777) != (archive_entry_mode(ae) & 0777)) {
		failure_start(file, line, "Mode (%02o) and entry mode (%02o) "
		    "mismatch", (unsigned int)mode,
		    (unsigned int)archive_entry_mode(ae));
		failure_finish(NULL);
		ret = 1;
	}
	if (n != 0) {
		failure_start(file, line, "Could not find match for ACL "
		    "(type=%#010x,permset=%#010x,tag=%d,qual=%d,name=``%s'')",
		    (unsigned int)acls[marker[0]].type,
		    (unsigned int)acls[marker[0]].permset,
		    acls[marker[0]].tag, acls[marker[0]].qual,
		    acls[marker[0]].name);
		failure_finish(NULL);
		ret = 1;
		/* Number of ACLs not matched should == 0 */
	}
	free(marker);
	return (ret);
}